

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::wrapupSwitchSubsequence
          (TParseContext *this,TIntermAggregate *statements,TIntermNode *branchNode)

{
  _List_node_base *this_00;
  long *plVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  _List_node_base *p_Var5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar6;
  long lVar7;
  undefined4 extraout_var_03;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  iterator __position;
  _func_int **pp_Var12;
  TIntermNode *local_40;
  TIntermAggregate *local_38;
  undefined4 extraout_var_02;
  
  this_00 = (this->super_TParseContextBase).switchSequenceStack.
            super_list<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
            .
            super__List_base<glslang::TVector<TIntermNode_*>_*,_glslang::pool_allocator<glslang::TVector<TIntermNode_*>_*>_>
            ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  local_40 = branchNode;
  if (statements != (TIntermAggregate *)0x0) {
    if (this_00[1]._M_next == this_00->_M_prev) {
      iVar4 = (**(statements->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode)(statements);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,CONCAT44(extraout_var,iVar4),
                 "cannot have statements before first case/default label","switch","");
    }
    (*(statements->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(statements,1);
    local_38 = statements;
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)this_00,
               (TIntermNode **)&local_38);
  }
  if (branchNode != (TIntermNode *)0x0) {
    p_Var5 = this_00->_M_prev;
    __position._M_current = (TIntermNode **)this_00[1]._M_next;
    if ((_List_node_base *)__position._M_current != p_Var5) {
      uVar8 = 0;
      uVar11 = 1;
      do {
        iVar4 = (*((TIntermNode *)(&p_Var5->_M_next)[uVar8])->_vptr_TIntermNode[0xd])();
        if (CONCAT44(extraout_var_00,iVar4) != 0) {
          plVar1 = *(long **)(CONCAT44(extraout_var_00,iVar4) + 0x28);
          iVar4 = (*branchNode->_vptr_TIntermNode[0xd])(branchNode);
          plVar2 = *(long **)(CONCAT44(extraout_var_01,iVar4) + 0x28);
          if (plVar1 == (long *)0x0 && plVar2 == (long *)0x0) {
            iVar4 = (**branchNode->_vptr_TIntermNode)(branchNode);
            uVar6 = CONCAT44(extraout_var_02,iVar4);
            pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar10 = "duplicate label";
            pcVar9 = "default";
LAB_00436636:
            (*pp_Var12[0x2d])(this,uVar6,pcVar10,pcVar9,"");
          }
          else if ((((plVar1 != (long *)0x0) && (plVar2 != (long *)0x0)) &&
                   (lVar7 = (**(code **)(*plVar1 + 0x28))(plVar1), lVar7 != 0)) &&
                  (lVar7 = (**(code **)(*plVar2 + 0x28))(plVar2), lVar7 != 0)) {
            lVar7 = (**(code **)(*plVar1 + 0x28))(plVar1);
            iVar4 = **(int **)(*(long *)(lVar7 + 0xc0) + 8);
            lVar7 = (**(code **)(*plVar2 + 0x28))(plVar2);
            if (iVar4 == **(int **)(*(long *)(lVar7 + 0xc0) + 8)) {
              iVar4 = (**branchNode->_vptr_TIntermNode)(branchNode);
              uVar6 = CONCAT44(extraout_var_03,iVar4);
              pp_Var12 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
              pcVar10 = "duplicated value";
              pcVar9 = "case";
              goto LAB_00436636;
            }
          }
        }
        p_Var5 = this_00->_M_prev;
        __position._M_current = (TIntermNode **)this_00[1]._M_next;
        bVar3 = uVar11 < (ulong)((long)__position._M_current - (long)p_Var5 >> 3);
        uVar8 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar3);
    }
    if ((_List_node_base *)__position._M_current == this_00[1]._M_prev) {
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
      _M_realloc_insert<TIntermNode*const&>
                ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)this_00,__position,
                 &local_40);
    }
    else {
      *__position._M_current = branchNode;
      this_00[1]._M_next = (_List_node_base *)&(this_00[1]._M_next)->_M_prev;
    }
  }
  return;
}

Assistant:

void TParseContext::wrapupSwitchSubsequence(TIntermAggregate* statements, TIntermNode* branchNode)
{
    TIntermSequence* switchSequence = switchSequenceStack.back();

    if (statements) {
        if (switchSequence->size() == 0)
            error(statements->getLoc(), "cannot have statements before first case/default label", "switch", "");
        statements->setOperator(EOpSequence);
        switchSequence->push_back(statements);
    }
    if (branchNode) {
        // check all previous cases for the same label (or both are 'default')
        for (unsigned int s = 0; s < switchSequence->size(); ++s) {
            TIntermBranch* prevBranch = (*switchSequence)[s]->getAsBranchNode();
            if (prevBranch) {
                TIntermTyped* prevExpression = prevBranch->getExpression();
                TIntermTyped* newExpression = branchNode->getAsBranchNode()->getExpression();
                if (prevExpression == nullptr && newExpression == nullptr)
                    error(branchNode->getLoc(), "duplicate label", "default", "");
                else if (prevExpression != nullptr &&
                          newExpression != nullptr &&
                         prevExpression->getAsConstantUnion() &&
                          newExpression->getAsConstantUnion() &&
                         prevExpression->getAsConstantUnion()->getConstArray()[0].getIConst() ==
                          newExpression->getAsConstantUnion()->getConstArray()[0].getIConst())
                    error(branchNode->getLoc(), "duplicated value", "case", "");
            }
        }
        switchSequence->push_back(branchNode);
    }
}